

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O0

int __thiscall Server::listen(Server *this,int __fd,int __n)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  runtime_error *prVar4;
  int *piVar5;
  char *pcVar6;
  ssize_t sVar7;
  iterator __first;
  iterator __last;
  reference piVar8;
  long lVar9;
  bool local_2e1;
  int *fileDescriptor;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  lock_guard<std::mutex> lock;
  future<void> result_4;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  local_228;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  itSocket;
  int result_3;
  char buffer [2];
  future<void> result_2;
  shared_ptr<ClientSocket> clientSocket;
  socklen_t sStack_1f0;
  int clientFileDescriptor;
  unsigned_long clientAddressLength;
  sockaddr_in clientAddress;
  int i;
  int newHighestFileDescriptor;
  int numFileDescriptors;
  int highestFileDescriptor;
  fd_set *__arr;
  undefined1 local_1b8 [4];
  uint __i;
  fd_set clientSocketSet;
  fd_set masterSocketSet;
  string local_b0 [32];
  int local_90;
  undefined1 local_8a;
  allocator local_89;
  int result_1;
  int local_64;
  int local_60;
  int result;
  uint32_t local_58;
  sockaddr_in socketAddress;
  int option;
  allocator local_31;
  string local_30 [32];
  Server *local_10;
  Server *this_local;
  
  local_10 = this;
  iVar2 = socket(2,1,0);
  this->_socket = iVar2;
  if (this->_socket == -1) {
    socketAddress.sin_zero[7] = '\x01';
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar6,&local_31);
    std::runtime_error::runtime_error(prVar4,local_30);
    socketAddress.sin_zero[7] = '\0';
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  socketAddress.sin_zero[0] = '\x01';
  socketAddress.sin_zero[1] = '\0';
  socketAddress.sin_zero[2] = '\0';
  socketAddress.sin_zero[3] = '\0';
  setsockopt(this->_socket,1,2,socketAddress.sin_zero,4);
  local_60 = 0;
  std::fill<char*,int>((char *)&result,(char *)socketAddress.sin_zero,&local_60);
  result._0_2_ = 2;
  local_58 = htonl(0);
  result._2_2_ = htons((uint16_t)this->_port);
  local_64 = bind(this->_socket,(sockaddr *)&result,0x10);
  if (local_64 == -1) {
    local_8a = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&result_1,pcVar6,&local_89);
    std::runtime_error::runtime_error(prVar4,(string *)&result_1);
    local_8a = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90 = ::listen(this->_socket,this->_backlog);
  if (local_90 == -1) {
    masterSocketSet.fds_bits[0xf]._6_1_ = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,pcVar6,(allocator *)((long)masterSocketSet.fds_bits + 0x7f));
    std::runtime_error::runtime_error(prVar4,local_b0);
    masterSocketSet.fds_bits[0xf]._6_1_ = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _numFileDescriptors = clientSocketSet.fds_bits + 0xf;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    _numFileDescriptors[__arr._4_4_] = 0;
  }
  lVar9 = (long)(this->_socket / 0x40);
  clientSocketSet.fds_bits[lVar9 + 0xf] =
       1L << ((byte)((long)this->_socket % 0x40) & 0x3f) | clientSocketSet.fds_bits[lVar9 + 0xf];
  newHighestFileDescriptor = this->_socket;
  do {
    memcpy(local_1b8,clientSocketSet.fds_bits + 0xf,0x80);
    iVar2 = select(newHighestFileDescriptor + 1,(fd_set *)local_1b8,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)0x0);
    if (iVar2 == -1) {
      return -1;
    }
    clientAddress.sin_zero[4] = (undefined1)newHighestFileDescriptor;
    clientAddress.sin_zero[5] = newHighestFileDescriptor._1_1_;
    clientAddress.sin_zero[6] = newHighestFileDescriptor._2_1_;
    clientAddress.sin_zero[7] = newHighestFileDescriptor._3_1_;
    clientAddress.sin_zero[0] = '\0';
    clientAddress.sin_zero[1] = '\0';
    clientAddress.sin_zero[2] = '\0';
    clientAddress.sin_zero[3] = '\0';
    for (; (int)clientAddress.sin_zero._0_4_ <= newHighestFileDescriptor;
        clientAddress.sin_zero._0_4_ = clientAddress.sin_zero._0_4_ + 1) {
      if ((*(ulong *)(local_1b8 + (long)((int)clientAddress.sin_zero._0_4_ / 0x40) * 8) &
          1L << ((byte)((long)(int)clientAddress.sin_zero._0_4_ % 0x40) & 0x3f)) != 0) {
        if (clientAddress.sin_zero._0_4_ == this->_socket) {
          _sStack_1f0 = 0x10;
          clientSocket.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = accept(this->_socket,(sockaddr *)&clientAddressLength,&sStack_1f0);
          if (clientSocket.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ == -1) break;
          clientSocketSet.fds_bits
          [(long)(clientSocket.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_ / 0x40) + 0xf] =
               1L << ((byte)((long)clientSocket.
                                   super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._4_4_ % 0x40) & 0x3f) |
               clientSocketSet.fds_bits
               [(long)(clientSocket.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_ / 0x40) + 0xf];
          piVar5 = std::max<int>(&newHighestFileDescriptor,
                                 (int *)((long)&clientSocket.
                                                super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi + 4));
          clientAddress.sin_zero._4_4_ = *piVar5;
          std::make_shared<ClientSocket,int&,Server&>
                    ((int *)&result_2.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,
                     (Server *)
                     ((long)&clientSocket.
                             super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
          bVar1 = std::function::operator_cast_to_bool((function *)&this->_handleAccept);
          if (bVar1) {
            std::
            async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                      ((launch)&result_3,(function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                       (shared_ptr<ClientSocket> *)&this->_handleAccept);
            std::future<void>::~future((future<void> *)&result_3);
          }
          std::
          vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
          push_back(&this->_clientSockets,
                    (value_type *)
                    &result_2.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
          std::shared_ptr<ClientSocket>::~shared_ptr
                    ((shared_ptr<ClientSocket> *)
                     &result_2.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        else {
          memset((void *)((long)&itSocket._M_current + 6),0,2);
          sVar7 = recv(clientAddress.sin_zero._0_4_,(void *)((long)&itSocket._M_current + 6),1,2);
          itSocket._M_current._0_4_ = (int)sVar7;
          if ((int)itSocket._M_current < 1) {
            close(this,clientAddress.sin_zero._0_4_);
          }
          else {
            __first = std::
                      vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                      ::begin(&this->_clientSockets);
            __last = std::
                     vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                     ::end(&this->_clientSockets);
            local_228 = std::
                        find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<ClientSocket>*,std::vector<std::shared_ptr<ClientSocket>,std::allocator<std::shared_ptr<ClientSocket>>>>,Server::listen()::__0>
                                  ((__normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
                                    )__first._M_current,
                                   (__normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
                                    )__last._M_current,
                                   (anon_class_8_1_54a39809_for__M_pred)clientAddress.sin_zero);
            result_4.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                 ::end(&this->_clientSockets);
            bVar1 = __gnu_cxx::operator!=
                              (&local_228,
                               (__normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
                                *)&result_4.super___basic_future<void>._M_state.
                                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
            local_2e1 = false;
            if (bVar1) {
              local_2e1 = std::function::operator_cast_to_bool((function *)&this->_handleRead);
            }
            if (local_2e1 != false) {
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
              ::operator*(&local_228);
              std::
              async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                        ((launch)&lock,(function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                         (shared_ptr<ClientSocket> *)&this->_handleRead);
              std::future<void>::~future((future<void> *)&lock);
            }
          }
        }
      }
    }
    piVar5 = std::max<int>((int *)(clientAddress.sin_zero + 4),&newHighestFileDescriptor);
    newHighestFileDescriptor = *piVar5;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&__range2,&this->_staleFileDescriptorsMutex);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->_staleFileDescriptors);
    fileDescriptor =
         (int *)std::vector<int,_std::allocator<int>_>::end(&this->_staleFileDescriptors);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&fileDescriptor), bVar1) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar2 = *piVar8;
      iVar3 = iVar2;
      if (iVar2 < 0) {
        iVar3 = iVar2 + 0x3f;
      }
      clientSocketSet.fds_bits[(long)(iVar3 >> 6) + 0xf] =
           clientSocketSet.fds_bits[(long)(iVar3 >> 6) + 0xf] & ~(1L << ((ulong)(byte)iVar2 & 0x3f))
      ;
      ::close(*piVar8);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::clear(&this->_staleFileDescriptors);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  } while( true );
}

Assistant:

void Server::listen()
{
  _socket = socket( AF_INET, SOCK_STREAM, 0 );

  if( _socket == -1 )
    throw std::runtime_error( std::string( strerror( errno ) ) );

  {
    int option = 1;

    setsockopt( _socket,
                SOL_SOCKET,
                SO_REUSEADDR,
                reinterpret_cast<const void*>( &option ),
                sizeof( option ) );
  }

  sockaddr_in socketAddress;

  std::fill( reinterpret_cast<char*>( &socketAddress ),
             reinterpret_cast<char*>( &socketAddress ) + sizeof( socketAddress ),
             0 );

  socketAddress.sin_family      = AF_INET;
  socketAddress.sin_addr.s_addr = htonl( INADDR_ANY );
  socketAddress.sin_port        = htons( _port );

  {
    int result = bind( _socket,
                       reinterpret_cast<const sockaddr*>( &socketAddress ),
                       sizeof( socketAddress ) );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  {
    int result = ::listen( _socket, _backlog );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  fd_set masterSocketSet;
  fd_set clientSocketSet;

  FD_ZERO( &masterSocketSet );
  FD_SET( _socket, &masterSocketSet );

  int highestFileDescriptor = _socket;

  while( 1 )
  {
    clientSocketSet = masterSocketSet;

    int numFileDescriptors = select( highestFileDescriptor + 1,
                                     &clientSocketSet,
                                     nullptr,   // no descriptors to write into
                                     nullptr,   // no descriptors with exceptions
                                     nullptr ); // no timeout

    if( numFileDescriptors == -1 )
      break;

    // Will be updated in the loop as soon as a new client has been
    // accepted. This saves us from modifying the variable *during*
    // the loop execution.
    int newHighestFileDescriptor = highestFileDescriptor;

    for( int i = 0; i <= highestFileDescriptor; i++ )
    {
      if( !FD_ISSET( i, &clientSocketSet ) )
        continue;

      // Handle new client
      if( i == _socket )
      {
        sockaddr_in clientAddress;
        auto clientAddressLength = sizeof(clientAddress);

        int clientFileDescriptor = accept( _socket,
                                           reinterpret_cast<sockaddr*>( &clientAddress ),
                                           reinterpret_cast<socklen_t*>( &clientAddressLength ) );

        if( clientFileDescriptor == -1 )
          break;

        FD_SET( clientFileDescriptor, &masterSocketSet );
        newHighestFileDescriptor = std::max( highestFileDescriptor, clientFileDescriptor );

        auto clientSocket = std::make_shared<ClientSocket>( clientFileDescriptor, *this );

        if( _handleAccept )
          auto result = std::async( std::launch::async, _handleAccept, clientSocket );

        _clientSockets.push_back( clientSocket );
      }

      // Known client socket
      else
      {
        char buffer[2] = {0,0};

        // Let's attempt to read at least one byte from the connection, but
        // without removing it from the queue. That way, the server can see
        // whether a client has closed the connection.
        int result = recv( i, buffer, 1, MSG_PEEK );

        if( result <= 0 )
        {
          // It would be easier to use erase-remove here, but this leads
          // to a deadlock. Instead, the current socket will be added to
          // the list of stale sockets and be closed later on.
          this->close( i );
        }
        else
        {
          auto itSocket = std::find_if( _clientSockets.begin(), _clientSockets.end(),
                                        [&] ( std::shared_ptr<ClientSocket> socket )
                                        {
                                          return socket->fileDescriptor() == i;
                                        } );

          if( itSocket != _clientSockets.end() && _handleRead )
            auto result = std::async( std::launch::async, _handleRead, *itSocket );
        }
      }
    }

    // Update the file descriptor if a new client has been accepted in
    // the loop above.
    highestFileDescriptor = std::max( newHighestFileDescriptor, highestFileDescriptor );

    // Handle stale connections. This is in an extra scope so that the
    // lock guard unlocks the mutex automatically.
    {
      std::lock_guard<std::mutex> lock( _staleFileDescriptorsMutex );

      for( auto&& fileDescriptor : _staleFileDescriptors )
      {
        FD_CLR( fileDescriptor, &masterSocketSet );
        ::close( fileDescriptor );
      }

      _staleFileDescriptors.clear();
    }
  }
}